

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AssignmentExpressions.cpp
# Opt level: O1

Expression *
slang::ast::NewCovergroupExpression::fromSyntax
          (Compilation *compilation,NewClassExpressionSyntax *syntax,ASTContext *context,
          Type *assignmentTarget)

{
  char *pcVar1;
  Type *pTVar2;
  ArgumentListSyntax *argSyntax;
  bool bVar3;
  int iVar4;
  undefined4 extraout_var;
  NewCovergroupExpression *pNVar5;
  EVP_PKEY_CTX *src;
  string_view symbolName;
  SourceRange range;
  SmallVector<const_slang::ast::Expression_*,_5UL> args;
  SourceRange local_90;
  SmallVectorBase<const_slang::ast::Expression_*> local_80 [2];
  span<const_slang::ast::Expression_*,_18446744073709551615UL> local_40;
  
  local_90 = slang::syntax::SyntaxNode::sourceRange((SyntaxNode *)syntax);
  if (assignmentTarget->canonical == (Type *)0x0) {
    Type::resolveCanonical(assignmentTarget);
  }
  pTVar2 = assignmentTarget->canonical;
  pcVar1 = local_80[0].firstElement;
  local_80[0].len = 0;
  local_80[0].cap = 5;
  argSyntax = syntax->argList;
  local_80[0].data_ = (pointer)pcVar1;
  if (*(int *)&pTVar2[1].super_Symbol.nextInScope != 0) {
    Scope::elaborate((Scope *)(pTVar2 + 1));
  }
  symbolName._M_str = "new";
  symbolName._M_len = 3;
  bVar3 = CallExpression::bindArgs
                    (argSyntax,
                     *(span<const_slang::ast::FormalArgumentSymbol_*const,_18446744073709551615UL> *
                      )&pTVar2[1].canonical,symbolName,local_90,context,local_80,false);
  if (bVar3) {
    iVar4 = SmallVectorBase<const_slang::ast::Expression_*>::copy
                      (local_80,(EVP_PKEY_CTX *)compilation,src);
    local_40._M_ptr = (pointer)CONCAT44(extraout_var,iVar4);
    pNVar5 = BumpAllocator::
             emplace<slang::ast::NewCovergroupExpression,slang::ast::Type_const&,std::span<slang::ast::Expression_const*,18446744073709551615ul>,slang::SourceRange&>
                       (&compilation->super_BumpAllocator,assignmentTarget,&local_40,&local_90);
  }
  else {
    pNVar5 = (NewCovergroupExpression *)Expression::badExpr(compilation,(Expression *)0x0);
  }
  if (local_80[0].data_ != (pointer)pcVar1) {
    operator_delete(local_80[0].data_);
  }
  return &pNVar5->super_Expression;
}

Assistant:

Expression& NewCovergroupExpression::fromSyntax(Compilation& compilation,
                                                const NewClassExpressionSyntax& syntax,
                                                const ASTContext& context,
                                                const Type& assignmentTarget) {
    auto range = syntax.sourceRange();
    auto& coverType = assignmentTarget.getCanonicalType().as<CovergroupType>();

    SmallVector<const Expression*> args;
    if (!CallExpression::bindArgs(syntax.argList, coverType.getArguments(), "new"sv, range, context,
                                  args, /* isBuiltInMethod */ false)) {
        return badExpr(compilation, nullptr);
    }

    return *compilation.emplace<NewCovergroupExpression>(assignmentTarget, args.copy(compilation),
                                                         range);
}